

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t
add_to_list(_internal_exr_context *ctxt,exr_attribute_list_t *list,exr_attribute_t *nattr,char *name
           )

{
  exr_attribute_t *peVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  exr_attribute_t **ppeVar6;
  long lVar7;
  exr_attr_chromaticities_t *peVar8;
  exr_attr_m33d_t *peVar9;
  uint uVar10;
  long lVar11;
  exr_result_t eVar12;
  ulong uVar13;
  exr_attribute_t **ppeVar14;
  
  uVar10 = list->num_attributes;
  lVar11 = (long)(int)uVar10;
  ppeVar14 = list->sorted_entries;
  if ((int)uVar10 < list->num_alloced) {
    ppeVar6 = list->entries;
  }
  else {
    uVar2 = (long)list->num_alloced * 2;
    uVar13 = lVar11 + 2;
    if (lVar11 + 1U <= uVar2) {
      uVar13 = uVar2;
    }
    ppeVar6 = (exr_attribute_t **)(*ctxt->alloc_fn)(uVar13 << 4);
    if (ppeVar6 == (exr_attribute_t **)0x0) {
      (*ctxt->free_fn)(nattr);
      uVar4 = (*ctxt->standard_error)(ctxt,1);
      uVar13 = (ulong)uVar4;
    }
    else {
      list->num_alloced = (int)uVar13;
      ppeVar14 = ppeVar6 + uVar13;
      if (0 < (int)uVar10) {
        lVar7 = 0;
        do {
          ppeVar6[lVar7] = list->entries[lVar7];
          ppeVar14[lVar7] = list->sorted_entries[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar11 != lVar7);
      }
      if (list->entries != (exr_attribute_t **)0x0) {
        (*ctxt->free_fn)(list->entries);
      }
      list->entries = ppeVar6;
      list->sorted_entries = ppeVar14;
    }
    if (ppeVar6 == (exr_attribute_t **)0x0) {
      return (exr_result_t)uVar13;
    }
  }
  ppeVar6[lVar11] = nattr;
  ppeVar14[lVar11] = nattr;
  while (uVar10 = uVar10 - 1, -1 < (int)uVar10) {
    peVar1 = ppeVar14[uVar10];
    iVar5 = strcmp(nattr->name,peVar1->name);
    if (-1 < iVar5) break;
    ppeVar14[(ulong)uVar10 + 1] = peVar1;
    ppeVar14[uVar10] = nattr;
  }
  list->num_attributes = (int)(lVar11 + 1U);
  switch(nattr->type) {
  case EXR_ATTR_BOX2I:
  case EXR_ATTR_BOX2F:
  case EXR_ATTR_CHLIST:
  case EXR_ATTR_FLOAT_VECTOR:
  case EXR_ATTR_STRING:
  case EXR_ATTR_STRING_VECTOR:
  case EXR_ATTR_V2D:
    peVar9 = (nattr->field_6).m33d;
    goto LAB_00111efa;
  case EXR_ATTR_CHROMATICITIES:
    peVar9 = (nattr->field_6).m33d;
    goto LAB_00111edf;
  case EXR_ATTR_COMPRESSION:
  case EXR_ATTR_ENVMAP:
  case EXR_ATTR_LINEORDER:
    (nattr->field_6).uc = '\0';
    break;
  case EXR_ATTR_DOUBLE:
    (nattr->field_6).d = 0.0;
    break;
  case EXR_ATTR_FLOAT:
  case EXR_ATTR_INT:
    (nattr->field_6).f = 0.0;
    break;
  case EXR_ATTR_KEYCODE:
    peVar9 = (nattr->field_6).m33d;
    *(undefined8 *)((long)peVar9->m + 0xc) = 0;
    *(undefined8 *)((long)peVar9->m + 0x14) = 0;
    goto LAB_00111efa;
  case EXR_ATTR_M33F:
    peVar9 = (nattr->field_6).m33d;
    peVar9->m[2] = 0.0;
    peVar9->m[3] = 0.0;
    peVar9->m[0] = 0.0;
    peVar9->m[1] = 0.0;
    *(undefined4 *)(peVar9->m + 4) = 0;
    break;
  case EXR_ATTR_M33D:
    peVar9 = (nattr->field_6).m33d;
    peVar9->m[6] = 0.0;
    peVar9->m[7] = 0.0;
    peVar9->m[4] = 0.0;
    peVar9->m[5] = 0.0;
    peVar9->m[2] = 0.0;
    peVar9->m[3] = 0.0;
    peVar9->m[0] = 0.0;
    peVar9->m[1] = 0.0;
    peVar9->m[8] = 0.0;
    break;
  case EXR_ATTR_M44F:
  case EXR_ATTR_M44D:
    peVar9 = (nattr->field_6).m33d;
    peVar9->m[6] = 0.0;
    peVar9->m[7] = 0.0;
    peVar9->m[4] = 0.0;
    peVar9->m[5] = 0.0;
LAB_00111edf:
    peVar9->m[2] = 0.0;
    peVar9->m[3] = 0.0;
LAB_00111efa:
    peVar9->m[0] = 0.0;
    peVar9->m[1] = 0.0;
    break;
  case EXR_ATTR_PREVIEW:
  case EXR_ATTR_V3D:
    peVar9 = (nattr->field_6).m33d;
    peVar9->m[0] = 0.0;
    peVar9->m[1] = 0.0;
    peVar9->m[2] = 0.0;
    break;
  case EXR_ATTR_RATIONAL:
  case EXR_ATTR_TIMECODE:
  case EXR_ATTR_V2I:
  case EXR_ATTR_V2F:
    peVar8 = (exr_attr_chromaticities_t *)(nattr->field_6).m33d;
    goto LAB_00111eb8;
  case EXR_ATTR_TILEDESC:
    peVar8 = (exr_attr_chromaticities_t *)(nattr->field_6).m33d;
    *(undefined1 *)&peVar8->green_x = 0;
    goto LAB_00111eb8;
  case EXR_ATTR_V3I:
  case EXR_ATTR_V3F:
    peVar8 = (nattr->field_6).chromaticities;
    peVar8->green_x = 0.0;
LAB_00111eb8:
    peVar8->red_x = 0.0;
    peVar8->red_y = 0.0;
    break;
  case EXR_ATTR_OPAQUE:
    peVar9 = (nattr->field_6).m33d;
    peVar9->m[4] = 0.0;
    peVar9->m[5] = 0.0;
    peVar9->m[2] = 0.0;
    peVar9->m[3] = 0.0;
    peVar9->m[0] = 0.0;
    peVar9->m[1] = 0.0;
    peVar9->m[6] = 0.0;
    break;
  default:
    bVar3 = false;
    eVar12 = 3;
    (*ctxt->print_error)(ctxt,3,"Invalid / unimplemented type (%s) in attr_init",nattr->type_name);
    goto LAB_00111f03;
  }
  eVar12 = 0;
  bVar3 = true;
LAB_00111f03:
  if (!bVar3) {
    exr_attr_list_remove((exr_context_t)ctxt,list,nattr);
  }
  return eVar12;
}

Assistant:

static exr_result_t
add_to_list (
    struct _internal_exr_context* ctxt,
    exr_attribute_list_t*         list,
    exr_attribute_t*              nattr,
    const char*                   name)
{
    int               cattrsz = list->num_attributes;
    int               nattrsz = cattrsz + 1;
    int               insertpos;
    exr_attribute_t** attrs        = list->entries;
    exr_attribute_t** sorted_attrs = list->sorted_entries;
    exr_result_t      rv           = EXR_ERR_SUCCESS;

    (void) name;
    if (nattrsz > list->num_alloced)
    {
        size_t nsize = (size_t) (list->num_alloced) * 2;
        if ((size_t) nattrsz > nsize) nsize = (size_t) (nattrsz) + 1;
        attrs = (exr_attribute_t**) ctxt->alloc_fn (
            sizeof (exr_attribute_t*) * nsize * 2);
        if (!attrs)
        {
            ctxt->free_fn (nattr);
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }

        list->num_alloced = (int32_t) nsize;
        sorted_attrs      = attrs + nsize;

        for (int i = 0; i < cattrsz; ++i)
        {
            attrs[i]        = list->entries[i];
            sorted_attrs[i] = list->sorted_entries[i];
        }

        if (list->entries) ctxt->free_fn (list->entries);
        list->entries        = attrs;
        list->sorted_entries = sorted_attrs;
    }
    attrs[cattrsz]        = nattr;
    sorted_attrs[cattrsz] = nattr;
    insertpos             = cattrsz - 1;

    // FYI: qsort is shockingly slow, just do a quick search and
    // bubble it up until it's in the correct location
    while (insertpos >= 0)
    {
        exr_attribute_t* prev = sorted_attrs[insertpos];

        if (strcmp (nattr->name, prev->name) >= 0) break;

        sorted_attrs[insertpos + 1] = prev;
        sorted_attrs[insertpos]     = nattr;
        --insertpos;
    }

    list->num_attributes = nattrsz;
    rv                   = attr_init (ctxt, nattr);
    if (rv != EXR_ERR_SUCCESS)
        exr_attr_list_remove ((exr_context_t) ctxt, list, nattr);
    return rv;
}